

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-output.c
# Opt level: O0

_Bool region_inside(region *loc,ui_event *key)

{
  ui_event *key_local;
  region *loc_local;
  
  if (((int)(uint)(key->mouse).x < loc->col) || (loc->col + loc->width <= (int)(uint)(key->mouse).x)
     ) {
    loc_local._7_1_ = false;
  }
  else if (((int)(uint)(key->mouse).y < loc->row) ||
          (loc->row + loc->page_rows <= (int)(uint)(key->mouse).y)) {
    loc_local._7_1_ = false;
  }
  else {
    loc_local._7_1_ = true;
  }
  return loc_local._7_1_;
}

Assistant:

bool region_inside(const region *loc, const ui_event *key)
{
	if ((loc->col > key->mouse.x) || (loc->col + loc->width <= key->mouse.x))
		return false;

	if ((loc->row > key->mouse.y) ||
		(loc->row + loc->page_rows <= key->mouse.y))
		return false;

	return true;
}